

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesNode.cpp
# Opt level: O3

void __thiscall chrono::ChVariablesNode::ArchiveIN(ChVariablesNode *this,ChArchiveIn *marchive)

{
  ChArchiveIn::VersionRead<chrono::ChVariablesNode>(marchive);
  (**(code **)(*(long *)marchive + 0x20))(marchive);
  return;
}

Assistant:

void ChVariablesNode::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChVariablesNode>();
    // deserialize parent class
    ChVariables::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(mass);
    SetNodeMass(mass);
}